

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O0

LY_ERR tro_ext_printer_tree(ly_bool compiled,void *ext,lyspr_tree_ctx *plug_ctx,ly_bool *ignore)

{
  long lVar1;
  undefined8 local_50;
  char *add_opts;
  char *flags;
  lyplg_ext *plugin;
  lysp_ext_instance *ext_pars;
  lysc_ext_instance *ext_comp;
  ly_bool *ignore_local;
  lyspr_tree_ctx *plug_ctx_local;
  void *ext_local;
  ly_bool compiled_local;
  
  add_opts = (char *)0x0;
  local_50 = 0;
  ext_comp = (lysc_ext_instance *)ignore;
  ignore_local = (ly_bool *)plug_ctx;
  plug_ctx_local = (lyspr_tree_ctx *)ext;
  ext_local._3_1_ = compiled;
  if (compiled == '\0') {
    lVar1 = *(long *)((long)ext + 0x48);
    flags = (char *)(lVar1 + 0x18);
    if (*(long *)(lVar1 + 0x40) == 0) {
      *ignore = '\x01';
      ext_local._4_4_ = LY_SUCCESS;
    }
    else {
      plugin = (lyplg_ext *)ext;
      ext_local._4_4_ = (**(code **)(lVar1 + 0x40))(ext,plug_ctx,&add_opts,&local_50);
    }
  }
  else {
    flags = *(char **)(*ext + 0x18);
    if (*(long *)(flags + 0x20) == 0) {
      *ignore = '\x01';
      ext_local._4_4_ = LY_SUCCESS;
    }
    else {
      ext_pars = (lysp_ext_instance *)ext;
      ext_local._4_4_ = (**(code **)(flags + 0x20))(ext,plug_ctx,&add_opts,&local_50);
    }
  }
  return ext_local._4_4_;
}

Assistant:

static LY_ERR
tro_ext_printer_tree(ly_bool compiled, void *ext, const struct lyspr_tree_ctx *plug_ctx, ly_bool *ignore)
{
    struct lysc_ext_instance *ext_comp;
    struct lysp_ext_instance *ext_pars;
    const struct lyplg_ext *plugin;
    const char *flags = NULL, *add_opts = NULL;

    if (compiled) {
        ext_comp = ext;
        plugin = ext_comp->def->plugin;
        if (!plugin->printer_ctree) {
            *ignore = 1;
            return LY_SUCCESS;
        }
        return plugin->printer_ctree(ext, plug_ctx, &flags, &add_opts);
    } else {
        ext_pars = ext;
        plugin = &ext_pars->record->plugin;
        if (!plugin->printer_ptree) {
            *ignore = 1;
            return LY_SUCCESS;
        }
        return plugin->printer_ptree(ext, plug_ctx, &flags, &add_opts);
    }

    return LY_SUCCESS;
}